

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void QHashPrivate::Node<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>::
     createInPlace<QGuiApplicationPrivate::SynthesizedMouseData_const&>
               (Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *n,QWindow **k,
               SynthesizedMouseData *args)

{
  Data *pDVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  
  n->key = *k;
  qVar2 = (args->pos).yp;
  qVar3 = (args->screenPos).xp;
  qVar4 = (args->screenPos).yp;
  (n->value).pos.xp = (args->pos).xp;
  (n->value).pos.yp = qVar2;
  (n->value).screenPos.xp = qVar3;
  (n->value).screenPos.yp = qVar4;
  pDVar1 = (args->window).wp.d;
  (n->value).window.wp.d = pDVar1;
  (n->value).window.wp.value = (args->window).wp.value;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

static void createInPlace(Node *n, Key &&k, Args &&... args)
    { new (n) Node{ std::move(k), T(std::forward<Args>(args)...) }; }